

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_priority.cxx
# Opt level: O2

void __thiscall
nuraft::raft_server::broadcast_priority_change(raft_server *this,int srv_id,int new_priority)

{
  int *piVar1;
  element_type *peVar2;
  element_type *this_00;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _List_node_base *p_Var5;
  __node_base *p_Var6;
  ptr<peer> pp;
  ptr<buffer> buf;
  undefined4 local_a8;
  int local_a4;
  ptr<req_msg> req;
  ptr<log_entry> le;
  string local_70;
  __shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> local_50;
  ptr<cluster_config> cur_config;
  
  if (this->id_ == srv_id) {
    this->my_priority_ = new_priority;
  }
  get_config((raft_server *)&cur_config);
  p_Var5 = (_List_node_base *)
           &(cur_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->servers_;
  while (p_Var5 = (((_List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                     *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var5 != (_List_node_base *)
                  &(cur_config.
                    super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   servers_) {
    piVar1 = (int *)p_Var5[1]._M_next;
    if (*piVar1 == srv_id) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        iVar4 = (**(code **)(*(long *)peVar2 + 0x38))();
        if (3 < iVar4) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_70,"Change server %d priority %d -> %d",(ulong)(uint)srv_id,
                     (ulong)(uint)piVar1[0x13],(ulong)(uint)new_priority);
          (**(code **)(*(long *)peVar2 + 0x40))
                    (peVar2,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                     ,"broadcast_priority_change",0x71,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
        }
      }
      piVar1[0x13] = new_priority;
    }
  }
  p_Var6 = &(this->peers_)._M_h._M_before_begin;
  while( true ) {
    p_Var6 = p_Var6->_M_nxt;
    if (p_Var6 == (__node_base *)0x0) break;
    local_70._M_dataplus._M_p =
         (pointer)(((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->term_).super___atomic_base<unsigned_long>._M_i;
    local_a4 = 0x18;
    local_a8 = *(undefined4 *)
                &(*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var6 + 2))->_M_max_load_factor)
                 ->_M_nxt->_M_nxt;
    iVar4 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_log_store[2])();
    buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)term_for_log(this,CONCAT44(extraout_var,iVar4) - 1);
    iVar4 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_log_store[2])();
    le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(CONCAT44(extraout_var_00,iVar4) + -1);
    pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i;
    std::
    make_shared<nuraft::req_msg,unsigned_long,nuraft::msg_type,int&,int,unsigned_long,unsigned_long,unsigned_long>
              ((unsigned_long *)&req,(msg_type *)&local_70,&local_a4,&this->id_,
               (unsigned_long *)&local_a8,(unsigned_long *)&buf,(unsigned_long *)&le);
    buffer::alloc((buffer *)&buf,8);
    buffer::pos(buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
    buffer::put(buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,srv_id);
    buffer::put(buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                new_priority);
    buffer::pos(buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
    local_70._M_dataplus._M_p =
         (pointer)(((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->term_).super___atomic_base<unsigned_long>._M_i;
    std::make_shared<nuraft::log_entry,unsigned_long,std::shared_ptr<nuraft::buffer>&>
              ((unsigned_long *)&le,(shared_ptr<nuraft::buffer> *)&local_70);
    std::
    vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
    ::push_back(&(req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 log_entries_,&le);
    std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)(p_Var6 + 2));
    bVar3 = peer::make_busy(pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    this_00 = pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (bVar3) {
      std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_50,&pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
      peer::send_req(this_00,(ptr<peer> *)&local_50,&req,&this->resp_handler_);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    }
    else {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        iVar4 = (**(code **)(*(long *)peVar2 + 0x38))();
        if (1 < iVar4) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_70,"peer %d is currently busy, cannot send request",
                     (ulong)(uint)(((pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->config_).
                                   super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->id_);
          (**(code **)(*(long *)peVar2 + 0x40))
                    (peVar2,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                     ,"broadcast_priority_change",0x92,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
        }
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&cur_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void raft_server::broadcast_priority_change(const int srv_id,
                                            const int new_priority)
{
    if (srv_id == id_) {
        my_priority_ = new_priority;
    }
    ptr<cluster_config> cur_config = get_config();
    for (auto& entry: cur_config->get_servers()) {
        srv_config* s_conf = entry.get();
        if (s_conf->get_id() == srv_id) {
            p_in("Change server %d priority %d -> %d",
                 srv_id, s_conf->get_priority(), new_priority);
            s_conf->set_priority(new_priority);
        }
    }

    // If there is no live leader now,
    // broadcast this request to all peers.
    for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
        ptr<req_msg> req( cs_new<req_msg>
                          ( state_->get_term(),
                            msg_type::priority_change_request,
                            id_,
                            it->second->get_id(),
                            term_for_log(log_store_->next_slot() - 1),
                            log_store_->next_slot() - 1,
                            quick_commit_index_.load() ) );

        // ID + priority
        ptr<buffer> buf = buffer::alloc(sz_int * 2);
        buf->pos(0);
        buf->put((int32)srv_id);
        buf->put((int32)new_priority);
        buf->pos(0);
        ptr<log_entry> le = cs_new<log_entry>(state_->get_term(), buf);

        std::vector< ptr<log_entry> >& v = req->log_entries();
        v.push_back(le);

        ptr<peer> pp = it->second;
        if (pp->make_busy()) {
            pp->send_req(pp, req, resp_handler_);
        } else {
            p_er("peer %d is currently busy, cannot send request",
                 pp->get_id());
        }
    }
}